

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderStructTests.cpp
# Opt level: O0

void deqp::anon_unknown_14::setUniform(Functions *gl,deUint32 programID,char *name,Vec3 *vec)

{
  glUniform3fvFunc p_Var1;
  GLint GVar2;
  GLenum err;
  float *pfVar3;
  char *msg;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  GLint local_2c;
  Vec3 *pVStack_28;
  int loc;
  Vec3 *vec_local;
  char *name_local;
  Functions *pFStack_10;
  deUint32 programID_local;
  Functions *gl_local;
  
  pVStack_28 = vec;
  vec_local = (Vec3 *)name;
  name_local._4_4_ = programID;
  pFStack_10 = gl;
  GVar2 = (*gl->getUniformLocation)(programID,name);
  p_Var1 = pFStack_10->uniform3fv;
  local_2c = GVar2;
  pfVar3 = tcu::Vector<float,_3>::getPtr(pVStack_28);
  (*p_Var1)(GVar2,1,pfVar3);
  err = (*pFStack_10->getError)();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Failed to set ",&local_71)
  ;
  std::operator+(&local_50,&local_70,(char *)vec_local);
  msg = (char *)std::__cxx11::string::c_str();
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderStructTests.cpp"
                  ,0x3ed);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

void setUniform(const glw::Functions& gl, deUint32 programID, const char* name, float value)
{
	int loc = gl.getUniformLocation(programID, name);
	gl.uniform1f(loc, value);
	CHECK_SET_UNIFORM(name);
}